

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool google::protobuf::compiler::anon_unknown_0::IsUpperUnderscore(string *name)

{
  char c_00;
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  ulong in_RDI;
  char c;
  int i;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= (ulong)(long)local_14) {
      return true;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
    c_00 = *pcVar3;
    bVar1 = IsUppercase(c_00);
    if (((!bVar1) && (c_00 != '_')) && (bVar1 = IsNumber(c_00), !bVar1)) break;
    local_14 = local_14 + 1;
  }
  return false;
}

Assistant:

bool IsUpperUnderscore(const string& name) {
  for (int i = 0; i < name.length(); i++) {
    const char c = name[i];
    if (!IsUppercase(c) && c != '_' && !IsNumber(c)) {
      return false;
    }
  }
  return true;
}